

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_innerproduct.cpp
# Opt level: O2

int test_innerproduct(Mat *a,int outch,int bias)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  prng_rand_t *state;
  float fVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  Mat activation_params;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,outch);
  ncnn::ParamDict::set(&pd,1,1);
  state = (prng_rand_t *)&pd;
  ncnn::ParamDict::set((ParamDict *)state,2,a->w * outch * a->h * a->c);
  uVar3 = prng_rand(state);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  ncnn::Mat::Mat(&activation_params,2,4,(Allocator *)0x0);
  fVar4 = RandomFloat(-1.0,0.0);
  *(float *)activation_params.data = fVar4;
  fVar4 = RandomFloat(0.0,1.0);
  *(float *)((long)activation_params.data + 4) = fVar4;
  ncnn::ParamDict::set(&pd,9,SUB164(auVar1 % ZEXT816(5),0));
  ncnn::ParamDict::set(&pd,10,&activation_params);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&weights,2,(allocator_type *)&opt);
  RandomMat((Mat *)&opt,a->w * outch * a->h * a->c);
  ncnn::Mat::operator=
            (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start,(Mat *)&opt);
  ncnn::Mat::~Mat((Mat *)&opt);
  RandomMat((Mat *)&opt,outch);
  ncnn::Mat::operator=
            (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start + 1,(Mat *)&opt);
  ncnn::Mat::~Mat((Mat *)&opt);
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar2 = test_layer<ncnn::InnerProduct>
                    ("InnerProduct",&pd,&weights,&opt,a,0.001,(_func_void_InnerProduct_ptr *)0x0);
  if (iVar2 != 0) {
    fprintf(_stderr,
            "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n"
            ,(double)*activation_params.data,(double)*(float *)((long)activation_params.data + 4),
            (ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c,outch,1,
            SUB168(auVar1 % ZEXT816(5),0));
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  ncnn::Mat::~Mat(&activation_params);
  ncnn::ParamDict::~ParamDict(&pd);
  return iVar2;
}

Assistant:

static int test_innerproduct(const ncnn::Mat& a, int outch, int bias)
{
    ncnn::ParamDict pd;
    pd.set(0, outch);// num_output
    pd.set(1, bias);// bias_term
    pd.set(2, outch*a.w*a.h*a.c);

    int activation_type = RAND() % 5;// 0 1 2 3 4
    ncnn::Mat activation_params(2);
    activation_params[0] = RandomFloat(-1, 0);// alpha
    activation_params[1] = RandomFloat(0, 1);// beta
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    std::vector<ncnn::Mat> weights(bias ? 2 : 1);
    weights[0] = RandomMat(outch*a.w*a.h*a.c);
    if (bias)
        weights[1] = RandomMat(outch);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::InnerProduct>("InnerProduct", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n", a.dims, a.w, a.h, a.c, outch, bias, activation_type, activation_params[0], activation_params[1]);
    }

    return ret;
}